

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O3

int upsampled_obmc_pref_error
              (MACROBLOCKD *xd,AV1_COMMON *cm,MV *this_mv,SUBPEL_SEARCH_VAR_PARAMS *var_params,
              uint *sse)

{
  int width;
  MV MVar1;
  int ref_stride;
  aom_variance_fn_ptr_t *paVar2;
  buf_2d *pbVar3;
  int32_t *piVar4;
  int32_t *piVar5;
  uint8_t *ref8;
  uint uVar6;
  uint8_t *comp_pred8;
  uint8_t pred [32768];
  
  paVar2 = var_params->vfp;
  pbVar3 = (var_params->ms_buffers).ref;
  width = var_params->w;
  piVar4 = (var_params->ms_buffers).wsrc;
  piVar5 = (var_params->ms_buffers).obmc_mask;
  MVar1 = *this_mv;
  ref_stride = pbVar3->stride;
  ref8 = pbVar3->buf + (((int)MVar1 >> 0x13) + ((int)MVar1.row >> 3) * ref_stride);
  uVar6 = (uint)MVar1 >> 0x10 & 7;
  if ((xd->cur_buf->flags & 8) == 0) {
    comp_pred8 = pred;
    aom_upsampled_pred_sse2
              (xd,cm,xd->mi_row,xd->mi_col,this_mv,comp_pred8,width,var_params->h,uVar6,
               (uint)MVar1 & 7,ref8,ref_stride,(uint)var_params->subpel_search_type);
  }
  else {
    comp_pred8 = (uint8_t *)((ulong)pred >> 1);
    aom_highbd_upsampled_pred_sse2
              (xd,cm,xd->mi_row,xd->mi_col,this_mv,comp_pred8,width,var_params->h,uVar6,
               (uint)MVar1 & 7,ref8,ref_stride,xd->bd,(uint)var_params->subpel_search_type);
  }
  uVar6 = (*paVar2->ovf)(comp_pred8,width,piVar4,piVar5,sse);
  return uVar6;
}

Assistant:

static int upsampled_obmc_pref_error(MACROBLOCKD *xd, const AV1_COMMON *cm,
                                     const MV *this_mv,
                                     const SUBPEL_SEARCH_VAR_PARAMS *var_params,
                                     unsigned int *sse) {
  const aom_variance_fn_ptr_t *vfp = var_params->vfp;
  const SUBPEL_SEARCH_TYPE subpel_search_type = var_params->subpel_search_type;
  const int w = var_params->w;
  const int h = var_params->h;

  const MSBuffers *ms_buffers = &var_params->ms_buffers;
  const int32_t *wsrc = ms_buffers->wsrc;
  const int32_t *mask = ms_buffers->obmc_mask;
  const uint8_t *ref = get_buf_from_mv(ms_buffers->ref, *this_mv);
  const int ref_stride = ms_buffers->ref->stride;

  const int subpel_x_q3 = get_subpel_part(this_mv->col);
  const int subpel_y_q3 = get_subpel_part(this_mv->row);

  const int mi_row = xd->mi_row;
  const int mi_col = xd->mi_col;

  unsigned int besterr;
  DECLARE_ALIGNED(16, uint8_t, pred[2 * MAX_SB_SQUARE]);
#if CONFIG_AV1_HIGHBITDEPTH
  if (is_cur_buf_hbd(xd)) {
    uint8_t *pred8 = CONVERT_TO_BYTEPTR(pred);
    aom_highbd_upsampled_pred(xd, cm, mi_row, mi_col, this_mv, pred8, w, h,
                              subpel_x_q3, subpel_y_q3, ref, ref_stride, xd->bd,
                              subpel_search_type);
    besterr = vfp->ovf(pred8, w, wsrc, mask, sse);
  } else {
    aom_upsampled_pred(xd, cm, mi_row, mi_col, this_mv, pred, w, h, subpel_x_q3,
                       subpel_y_q3, ref, ref_stride, subpel_search_type);

    besterr = vfp->ovf(pred, w, wsrc, mask, sse);
  }
#else
  aom_upsampled_pred(xd, cm, mi_row, mi_col, this_mv, pred, w, h, subpel_x_q3,
                     subpel_y_q3, ref, ref_stride, subpel_search_type);

  besterr = vfp->ovf(pred, w, wsrc, mask, sse);
#endif
  return besterr;
}